

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall QtMWidgets::Slider::mousePressEvent(Slider *this,QMouseEvent *e)

{
  uint uVar1;
  uint uVar2;
  MouseButton other;
  Int IVar3;
  MouseButton MVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  SliderPrivate *pSVar8;
  ulong uVar9;
  SliderPrivate *pSVar10;
  socklen_t *__addr_len;
  sockaddr *__addr;
  QMouseEvent *pQVar11;
  SliderAction SVar12;
  bool bVar13;
  QPoint local_60;
  QPoint local_58;
  QPoint local_50;
  QPoint local_48;
  int local_40;
  int local_3c;
  int pressValue;
  SliderAction action;
  undefined1 local_30 [8];
  QRect hr;
  QMouseEvent *e_local;
  Slider *this_local;
  
  pQVar11 = e;
  uVar1 = QAbstractSlider::maximum();
  other = (MouseButton)pQVar11;
  uVar2 = QAbstractSlider::minimum();
  __addr_len = (socklen_t *)(ulong)uVar1;
  bVar13 = true;
  if (uVar1 != uVar2) {
    hr.x2 = (int)QSinglePointEvent::buttons((QSinglePointEvent *)e);
    other = QSinglePointEvent::button((QSinglePointEvent *)e);
    hr.y2 = (int)QFlags<Qt::MouseButton>::operator^((QFlags<Qt::MouseButton> *)&hr.x2,other);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&hr.y2);
    bVar13 = IVar3 != 0;
  }
  if (bVar13) {
    QEvent::ignore((QEvent *)e);
  }
  else {
    MVar4 = QSinglePointEvent::button((QSinglePointEvent *)e);
    if (MVar4 == LeftButton) {
      QEvent::accept((QEvent *)e,other,__addr,__addr_len);
      pSVar8 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
               ::operator->(&this->d);
      _local_30 = SliderPrivate::handleRect(pSVar8);
      _pressValue = QMouseEvent::pos(e);
      uVar9 = QRect::contains((QPoint *)local_30,SUB81(&pressValue,0));
      SVar12 = (SliderAction)this;
      if ((uVar9 & 1) == 0) {
        pSVar8 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
                 ::operator->(&this->d);
        pSVar8->pressedControl = SC_ComboBoxFrame;
        local_3c = 0;
        pSVar8 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
                 ::operator->(&this->d);
        pSVar10 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
                  ::operator->(&this->d);
        local_48 = QMouseEvent::pos(e);
        iVar5 = SliderPrivate::pick(pSVar10,&local_48);
        pSVar10 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
                  ::operator->(&this->d);
        iVar6 = SliderPrivate::pixelPosToRangeValue(pSVar8,iVar5 + pSVar10->radius * -2);
        local_40 = iVar6;
        iVar7 = QAbstractSlider::value();
        iVar5 = local_40;
        if (iVar7 < iVar6) {
          local_3c = 3;
        }
        else {
          iVar6 = QAbstractSlider::value();
          if (iVar5 < iVar6) {
            local_3c = 4;
          }
        }
        if (local_3c != 0) {
          QAbstractSlider::triggerAction(SVar12);
          QAbstractSlider::setRepeatAction(SVar12,local_3c,500);
        }
      }
      else {
        pSVar8 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
                 ::operator->(&this->d);
        pSVar8->pressedControl = SC_ComboBoxEditField;
        QAbstractSlider::setRepeatAction(SVar12,0,500);
        QAbstractSlider::triggerAction(SVar12);
        QWidget::update();
      }
      pSVar8 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
               ::operator->(&this->d);
      if (pSVar8->pressedControl == SC_ComboBoxEditField) {
        pSVar8 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
                 ::operator->(&this->d);
        local_58 = QMouseEvent::pos(e);
        local_60 = QRect::topLeft((QRect *)local_30);
        local_50 = operator-(&local_58,&local_60);
        iVar5 = SliderPrivate::pick(pSVar8,&local_50);
        pSVar8 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
                 ::operator->(&this->d);
        pSVar8->clickOffset = iVar5;
        QAbstractSlider::setRepeatAction(SVar12,0,500);
        QAbstractSlider::setSliderDown(SUB81(this,0));
      }
    }
    else {
      QEvent::ignore((QEvent *)e);
    }
  }
  return;
}

Assistant:

void
Slider::mousePressEvent( QMouseEvent * e )
{
	if( maximum() == minimum() || ( e->buttons() ^ e->button() ) )
	{
		e->ignore();
		return;
	}

	if( e->button() == Qt::LeftButton )
	{
		e->accept();
		const QRect hr = d->handleRect();

		if( hr.contains( e->pos() ) )
		{
			d->pressedControl = QStyle::SC_SliderHandle;
			setRepeatAction( SliderNoAction );
			triggerAction( SliderMove );
			update();
		}
		else
		{
			d->pressedControl = QStyle::SC_SliderGroove;
			SliderAction action = SliderNoAction;

			const int pressValue =
				d->pixelPosToRangeValue( d->pick( e->pos() ) - 2 * d->radius );

			if( pressValue > value() )
				action = SliderPageStepAdd;
			else if( pressValue < value() )
				action = SliderPageStepSub;
			if( action )
			{
				triggerAction( action );
				setRepeatAction( action );
			}
		}

		if( d->pressedControl == QStyle::SC_SliderHandle )
		{
			d->clickOffset = d->pick( e->pos() - hr.topLeft() );
			setRepeatAction( SliderNoAction );
			setSliderDown( true );
		}
	}
	else
		e->ignore();
}